

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void __thiscall apngasm_cli::Options::Options(Options *this,int argc,char **argv)

{
  options_description *this_00;
  uint uVar1;
  variables_map *pvVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<int,_char> *ptVar5;
  char *pcVar6;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar7;
  _List_node_base *p_Var8;
  uint uVar9;
  allocator<char> local_2c7;
  allocator<char> local_2c6;
  allocator<char> local_2c5;
  int local_2c4;
  variables_map *local_2c0;
  undefined8 local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  OPTGROUPS opts_packer;
  int local_26c;
  parsed_options parsed;
  command_line_parser parser;
  options_description hidden_opts;
  positional_options_description positional_opts;
  options_description all_opts;
  
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c0 = &this->vm;
  local_2c4 = argc;
  boost::program_options::variables_map::variables_map(local_2c0);
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  this_00 = &this->visible_opts;
  uVar9 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (this_00,(uint)boost::program_options::options_description::m_default_line_length,uVar9)
  ;
  this->overwrite_mode = 0;
  opts_packer.
  super__List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&opts_packer;
  opts_packer.
  super__List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ._M_impl._M_node._M_size = 0;
  opts_packer.
  super__List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       opts_packer.
       super__List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  boost::program_options::positional_options_description::positional_options_description
            (&positional_opts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,"Information Options",(allocator<char> *)&parsed);
  boost::program_options::options_description::options_description
            (&all_opts,(string *)&parser,uVar1,uVar9);
  std::__cxx11::string::~string((string *)&parser);
  parser._0_8_ = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&parser,"version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar3,"help,h");
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(&opts_packer,&all_opts);
  boost::program_options::options_description::add(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parsed,"Main Options",(allocator<char> *)&hidden_opts);
  boost::program_options::options_description::options_description
            ((options_description *)&parser,(string *)&parsed,uVar1,uVar9);
  std::__cxx11::string::~string((string *)&parsed);
  local_2b8 = boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&parsed,"100",&local_2c5);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&parsed);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_2b8,(value_semantic *)"delay,d",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>();
  local_26c = 0;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,&local_26c);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"loops,l",(char *)ptVar5);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"file,f",(char *)ptVar4);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"skip,s");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"disassemble,D",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"output,o",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hidden_opts,"animation.json",&local_2c6);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar4,&hidden_opts.m_caption);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"json,j",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"animation.xml",&local_2c7);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar4,&local_2b0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"xml,x",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&hidden_opts);
  std::__cxx11::string::~string((string *)&parsed);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(&opts_packer,(value_type *)&parser);
  boost::program_options::options_description::add(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hidden_opts,"Overwrite Options",(allocator<char> *)&local_2b0);
  boost::program_options::options_description::options_description
            ((options_description *)&parsed,(string *)&hidden_opts,uVar1,uVar9);
  std::__cxx11::string::~string((string *)&hidden_opts);
  hidden_opts.m_caption._M_dataplus._M_p =
       (pointer)boost::program_options::options_description::add_options();
  pcVar3 = (char *)operator_new(8);
  *(undefined ***)pcVar3 = &PTR_name_abi_cxx11__00155110;
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&hidden_opts,(value_semantic *)"nooverwrite,n",pcVar3);
  pcVar6 = (char *)operator_new(8);
  *(undefined ***)pcVar6 = &PTR_name_abi_cxx11__00155110;
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"interactive,i",pcVar6);
  pcVar6 = (char *)operator_new(8);
  *(undefined ***)pcVar6 = &PTR_name_abi_cxx11__00155110;
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"force,F",pcVar6);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(&opts_packer,(value_type *)&parsed);
  boost::program_options::options_description::add(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"Hidden options",(allocator<char> *)&local_2b8);
  boost::program_options::options_description::options_description
            (&hidden_opts,(string *)&local_2b0,uVar1,uVar9);
  std::__cxx11::string::~string((string *)&local_2b0);
  local_2b0._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  ptVar7 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_2b0,(value_semantic *)"files",(char *)ptVar7);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
               *)&opts_packer,&hidden_opts);
  boost::program_options::positional_options_description::add((char *)&positional_opts,0x13f459);
  boost::program_options::options_description::~options_description(&hidden_opts);
  boost::program_options::options_description::~options_description((options_description *)&parsed);
  boost::program_options::options_description::~options_description((options_description *)&parser);
  boost::program_options::options_description::~options_description(&all_opts);
  boost::program_options::options_description::options_description(&all_opts,uVar1,uVar9);
  pvVar2 = local_2c0;
  p_Var8 = (_List_node_base *)&opts_packer;
  while (p_Var8 = (((_List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
                     *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&opts_packer) {
    boost::program_options::options_description::add(&all_opts);
  }
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&parser,local_2c4,argv);
  boost::program_options::basic_command_line_parser<char>::options(&parser,&all_opts);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)&parser);
  boost::program_options::basic_command_line_parser<char>::run(&parsed,&parser);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::operator=(&this->option_vec,&parsed.options);
  boost::program_options::store((basic_parsed_options *)&parsed,pvVar2,false);
  boost::program_options::notify(pvVar2);
  setOverwriteMode(this);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&parsed.options);
  boost::program_options::detail::cmdline::~cmdline(&parser.super_cmdline);
  boost::program_options::options_description::~options_description(&all_opts);
  boost::program_options::positional_options_description::~positional_options_description
            (&positional_opts);
  std::__cxx11::
  _List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::_M_clear(&opts_packer.
              super__List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
            );
  return;
}

Assistant:

Options::Options(int argc, char **argv)
    : overwrite_mode(OVERWRITE_INTERACTIVE) {
  namespace po = boost::program_options;

  typedef std::list<po::options_description> OPTGROUPS;
  OPTGROUPS opts_packer;
  po::positional_options_description positional_opts;
  processOptions(opts_packer, visible_opts, positional_opts);

  // pack all options & parse it
  po::options_description all_opts;
  {
    OPTGROUPS::const_iterator it = opts_packer.begin();
    for (; it != opts_packer.end(); ++it) {
      all_opts.add(*it);
    }
  }
  po::command_line_parser parser(argc, argv);
  parser.options(all_opts);
  parser.positional(positional_opts);
  po::parsed_options parsed = parser.run();
  option_vec = parsed.options;
  po::store(parsed, vm);
  po::notify(vm);

  setOverwriteMode();
}